

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SearchableObjectHolder.hpp
# Opt level: O3

vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_> *
__thiscall
gmlc::concurrency::SearchableObjectHolder<helics::Broker,_helics::CoreType>::getObjects
          (vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
           *__return_storage_ptr__,SearchableObjectHolder<helics::Broker,_helics::CoreType> *this)

{
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  for (p_Var2 = *(_Rb_tree_node_base **)(this + 0x40); p_Var2 != (_Rb_tree_node_base *)(this + 0x30)
      ; p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::vector<std::shared_ptr<helics::Broker>,_std::allocator<std::shared_ptr<helics::Broker>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)(p_Var2 + 2));
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::shared_ptr<X>> getObjects()
    {
        std::vector<std::shared_ptr<X>> objs;
        std::lock_guard<std::mutex> lock(mapLock);
        for (auto& obj : objectMap) {
            objs.push_back(obj.second);
        }
        return objs;
    }